

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O2

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CMainClass *stm)

{
  CIdExp *pCVar1;
  CMainMethod *pCVar2;
  element_type *peVar3;
  ClassInfo *pCVar4;
  VariablesInfo *this_00;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__cxx11::string::assign
            ((char *)&((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->iName);
  pCVar1 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar1 != (CIdExp *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
  }
  pCVar4 = (ClassInfo *)operator_new(0x88);
  ClassInfo::ClassInfo
            (pCVar4,&((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->iName);
  std::__shared_ptr<ClassInfo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ClassInfo,void>
            ((__shared_ptr<ClassInfo,(__gnu_cxx::_Lock_policy)2> *)&local_48,pCVar4);
  std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *)
             (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_48)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  this_00 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(this_00);
  std::__shared_ptr<VariablesInfo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<VariablesInfo,void>
            ((__shared_ptr<VariablesInfo,(__gnu_cxx::_Lock_policy)2> *)&local_48,this_00);
  std::__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->fields).
              super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  pCVar2 = (stm->mainMethod)._M_t.
           super___uniq_ptr_impl<CMainMethod,_std::default_delete<CMainMethod>_>._M_t.
           super__Tuple_impl<0UL,_CMainMethod_*,_std::default_delete<CMainMethod>_>.
           super__Head_base<0UL,_CMainMethod_*,_false>._M_head_impl;
  if (pCVar2 != (CMainMethod *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
  }
  peVar3 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar4 = (peVar3->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&(peVar3->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>
            );
  ClassInfo::AddMethod(pCVar4,(shared_ptr<MethodInfo> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CMainClass &stm )
{
//	std::cout << "mainclass\n";
	info->iName = "";
	if( stm.id ) {
		stm.id->Accept( *this );
	}
	info->iClass = std::shared_ptr<ClassInfo>( new ClassInfo( info->iName ) );
	info->iClass->fields = std::shared_ptr<VariablesInfo>( new VariablesInfo() );

	info->iMethod = nullptr;
	if( stm.mainMethod ) {
		stm.mainMethod->Accept( *this );
	}
	info->iClass->AddMethod( info->iMethod );
}